

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

uchar readuchar(FILE *f)

{
  size_t sVar1;
  uchar local_19;
  FILE *pFStack_18;
  uchar c1;
  FILE *f_local;
  
  pFStack_18 = f;
  sVar1 = fread(&local_19,1,1,(FILE *)f);
  if (sVar1 == 0) {
    fprintf(_stderr,"\nError: fread return a number of element different from the expected.\n");
    f_local._7_1_ = '\0';
  }
  else {
    f_local._7_1_ = local_19;
  }
  return f_local._7_1_;
}

Assistant:

static unsigned char readuchar(FILE * f)
{
    unsigned char c1;
    if (!fread(&c1, 1, 1, f)) {
        fprintf(stderr,
                "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    return c1;
}